

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Freight_train.cpp
# Opt level: O0

void __thiscall Freight_train::set_weight_of_freight(Freight_train *this)

{
  byte bVar1;
  long lVar2;
  ostream *this_00;
  bool bVar3;
  Freight_train *this_local;
  
  std::operator<<((ostream *)&std::cout,"Enter weight of freight: ");
  std::istream::operator>>((istream *)&std::cin,&this->weight_of_freight);
  while( true ) {
    bVar1 = std::ios::fail();
    bVar3 = true;
    if ((bVar1 & 1) == 0) {
      bVar3 = this->weight_of_freight == 0;
    }
    if (!bVar3) break;
    std::ios::clear((long)&std::cin + *(long *)(std::cin + -0x18),0);
    lVar2 = std::numeric_limits<long>::max();
    std::istream::ignore((long)&std::cin,(int)lVar2);
    this_00 = std::operator<<((ostream *)&std::cout,"Your input data is incorrect, try again");
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    std::istream::operator>>((istream *)&std::cin,&this->weight_of_freight);
  }
  return;
}

Assistant:

void Freight_train::set_weight_of_freight() {
    std::cout << "Enter weight of freight: ";
    std::cin >> weight_of_freight;
    while (std::cin.fail() || weight_of_freight == 0) {
        std::cin.clear();
        std::cin.ignore(numeric_limits<streamsize>::max(), '\n');
        std::cout << "Your input data is incorrect, try again" << std::endl;
        std::cin >> weight_of_freight;
    }
}